

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music.c
# Opt level: O3

void awaken_monsters(int distance)

{
  int iVar1;
  monst *mtmp;
  
  mtmp = level->monlist;
  if (mtmp != (monst *)0x0) {
    do {
      if (0 < mtmp->mhp) {
        iVar1 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if (iVar1 < distance) {
          *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff3ffff | 0x40000;
          mtmp->mfrozen = '\0';
          if (iVar1 < distance / 3) {
            iVar1 = resist(mtmp,'\x06',0,0);
            if (iVar1 == 0) {
              monflee(mtmp,0,'\0','\x01');
            }
          }
        }
      }
      mtmp = mtmp->nmon;
    } while (mtmp != (monst *)0x0);
  }
  return;
}

Assistant:

static void awaken_monsters(int distance)
{
	struct monst *mtmp = level->monlist;
	int distm;

	while (mtmp) {
	    if (!DEADMONSTER(mtmp)) {
		distm = distu(mtmp->mx, mtmp->my);
		if (distm < distance) {
		    mtmp->msleeping = 0;
		    mtmp->mcanmove = 1;
		    mtmp->mfrozen = 0;
		    /* May scare some monsters */
		    if (distm < distance/3 &&
			    !resist(mtmp, TOOL_CLASS, 0, NOTELL))
			monflee(mtmp, 0, FALSE, TRUE);
		}
	    }
	    mtmp = mtmp->nmon;
	}
}